

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Helpers.cpp
# Opt level: O2

JsTTDStreamHandle
Helpers::TTCreateStreamCallback
          (size_t uriLength,char *uri,size_t asciiNameLength,char *asciiName,bool read,bool write)

{
  code *pcVar1;
  PAL_FILE *pPVar2;
  PAL_FILE *stream;
  char *mode;
  undefined7 in_register_00000081;
  undefined7 in_register_00000089;
  char local_248 [8];
  char path [512];
  
  if ((int)CONCAT71(in_register_00000081,read) == (int)CONCAT71(in_register_00000089,write)) {
    pPVar2 = PAL_get_stderr(0);
    PAL_fprintf(pPVar2,"ASSERTION (%s, line %d) %s %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/bin/ch/Helpers.cpp"
                ,0x256,"(read | write) & (!read | !write)",
                "Read/Write streams not supported yet -- defaulting to read only");
    pPVar2 = PAL_get_stderr(0);
    PAL_fflush(pPVar2);
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  if (0xfffffffffffffdfe < (uriLength + asciiNameLength) - 0x200) {
    memset(local_248,0,0x200);
    memcpy_s(local_248,0x200,uri,uriLength);
    memcpy_s(local_248 + uriLength,0x200 - uriLength,asciiName,asciiNameLength);
    mode = "r+b";
    if (write) {
      mode = "w+b";
    }
    pPVar2 = PAL_fopen(local_248,mode);
    if (pPVar2 == (PAL_FILE *)0x0) {
      stream = PAL_get_stderr(0);
      PAL_fprintf(stream,"Failed to open file: %s\n",local_248);
    }
    TTReportLastIOErrorAsNeeded((uint)(pPVar2 != (PAL_FILE *)0x0),"Failed File Open");
    return pPVar2;
  }
  PAL_wprintf(L"We assume bounded MAX_URI_LENGTH for simplicity.");
  PAL_exit(1);
}

Assistant:

JsTTDStreamHandle CALLBACK Helpers::TTCreateStreamCallback(size_t uriLength, const char* uri, size_t asciiNameLength, const char* asciiName, bool read, bool write)
{
    AssertMsg((read | write) & (!read | !write), "Read/Write streams not supported yet -- defaulting to read only");

    if(uriLength + asciiNameLength + 1 > MAX_URI_LENGTH)
    {
        wprintf(_u("We assume bounded MAX_URI_LENGTH for simplicity."));
        exit(1);
    }

    char path[MAX_URI_LENGTH];
    memset(path, 0, MAX_URI_LENGTH);

    memcpy_s(path, MAX_URI_LENGTH, uri, uriLength);
    memcpy_s(path + uriLength, MAX_URI_LENGTH - uriLength, asciiName, asciiNameLength);

    JsTTDStreamHandle res = TTDHostOpen(uriLength + asciiNameLength, path, write);
    if(res == nullptr)
    {
        fprintf(stderr, "Failed to open file: %s\n", path);
    }

    Helpers::TTReportLastIOErrorAsNeeded(res != nullptr, "Failed File Open");
    return res;
}